

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O1

h__Reader * __thiscall
AS_02::PCM::MXFReader::h__Reader::ReadFrame
          (h__Reader *this,ui32_t FrameNum,FrameBuffer *FrameBuf,AESDecContext *param_3,
          HMACContext *param_4)

{
  char cVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  long lVar3;
  undefined1 *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int64_t tmp_pos;
  long local_a0;
  Result_t local_98 [104];
  
  lVar3 = CONCAT44(in_register_00000034,FrameNum);
  cVar1 = (**(code **)(**(long **)(lVar3 + 0x10) + 0x40))();
  if (cVar1 == '\0') {
    puVar4 = Kumu::RESULT_INIT;
  }
  else {
    if ((uint)FrameBuf < *(uint *)(lVar3 + 0x510)) {
      lVar6 = *(long *)(lVar3 + 0x500);
      if (lVar6 == 0) {
        __assert_fail("m_ClipEssenceBegin",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                      ,0xa6,
                      "ASDCP::Result_t AS_02::PCM::MXFReader::h__Reader::ReadFrame(ui32_t, ASDCP::PCM::FrameBuffer &, ASDCP::AESDecContext *, ASDCP::HMACContext *)"
                     );
      }
      uVar5 = *(uint *)(lVar3 + 0x514);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      (**(code **)(**(long **)(lVar3 + 0x10) + 0x30))(local_98,*(long **)(lVar3 + 0x10),&local_a0);
      lVar9 = (ulong)uVar5 * ((ulong)FrameBuf & 0xffffffff);
      lVar6 = lVar6 + lVar9;
      Kumu::Result_t::~Result_t(local_98);
      if (local_a0 != lVar6) {
        (**(code **)(**(long **)(lVar3 + 0x10) + 0x28))(local_98,*(long **)(lVar3 + 0x10),lVar6,0);
        Kumu::Result_t::operator=((Result_t *)this,local_98);
        Kumu::Result_t::~Result_t(local_98);
      }
      if (*(int *)&(this->super_h__AS02Reader).
                   super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                   _vptr_TrackFileReader < 0) {
        return this;
      }
      uVar7 = *(long *)(lVar3 + 0x508) - lVar9;
      uVar8 = uVar7 & 0xffffffff;
      if (*(uint *)(lVar3 + 0x514) <= uVar7) {
        uVar8 = (ulong)*(uint *)(lVar3 + 0x514);
      }
      uVar5 = (uint)uVar8;
      (**(code **)(**(long **)(lVar3 + 0x10) + 0x38))
                (local_98,*(long **)(lVar3 + 0x10),*(undefined8 *)(param_3 + 8),uVar8,0);
      Kumu::Result_t::operator=((Result_t *)this,local_98);
      Kumu::Result_t::~Result_t(local_98);
      if (*(int *)&(this->super_h__AS02Reader).
                   super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                   _vptr_TrackFileReader < 0) {
        return this;
      }
      *(uint *)(param_3 + 0x18) = uVar5;
      uVar2 = *(uint *)(param_3 + 0x10) - uVar5;
      if (*(uint *)(param_3 + 0x10) < uVar5 || uVar2 == 0) {
        return this;
      }
      memset((void *)(uVar8 + *(long *)(param_3 + 8)),0,(ulong)uVar2);
      return this;
    }
    puVar4 = ASDCP::RESULT_RANGE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar4);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFReader::h__Reader::ReadFrame(ui32_t FrameNum, ASDCP::PCM::FrameBuffer& FrameBuf,
					    ASDCP::AESDecContext*, ASDCP::HMACContext*)
{
  if ( ! m_File->IsOpen() )
    {
      return RESULT_INIT;
    }

  if ( ! ( FrameNum < m_ClipDurationFrames ) )
    {
      return RESULT_RANGE;
    }

  assert(m_ClipEssenceBegin);
  ui64_t offset = static_cast<ui64_t>(FrameNum) * static_cast<ui64_t>(m_BytesPerFrame);
  ui64_t position = m_ClipEssenceBegin + offset;
  Result_t result = RESULT_OK;

  if ( m_File->TellPosition() != static_cast<Kumu::fpos_t>(position) )
    {
      result = m_File->Seek(position);
    }

  if ( KM_SUCCESS(result) )
    {
      ui64_t remainder = m_ClipSize - offset;
      ui32_t read_size = ( remainder < m_BytesPerFrame ) ? remainder : m_BytesPerFrame;
      result = m_File->Read(FrameBuf.Data(), read_size);

      if ( KM_SUCCESS(result) )
	{
	  FrameBuf.Size(read_size);

	  if ( read_size < FrameBuf.Capacity() )
	    {
	      memset(FrameBuf.Data() + FrameBuf.Size(), 0, FrameBuf.Capacity() - FrameBuf.Size());
	    }
	}
    }

  return result;
}